

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

longlong __thiscall Graph::solve(Graph *this)

{
  uint uVar1;
  long lVar2;
  size_type sVar3;
  reference pvVar4;
  longlong *plVar5;
  vector<int,_std::allocator<int>_> *pvVar6;
  longlong lStack_90;
  longlong alStack_88 [2];
  vector<int,_std::allocator<int>_> *local_78;
  long local_70;
  vector<int,_std::allocator<int>_> *local_68;
  ulong local_60;
  Graph *local_58;
  longlong *local_50;
  int local_44;
  int local_40;
  int j;
  int i;
  int k;
  unsigned_long __vla_expr0;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> temp;
  Graph *this_local;
  
  lStack_90 = 0x104cb0;
  local_58 = this;
  temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  ts((vector<int,_std::allocator<int>_> *)local_28,this);
  uVar1 = local_58->size;
  lVar2 = -((ulong)uVar1 * 8 + 0xf & 0xfffffffffffffff0);
  plVar5 = (longlong *)((long)alStack_88 + lVar2);
  for (j = 0; j < local_58->size; j = j + 1) {
    plVar5[j] = 0;
  }
  plVar5[local_58->size + -1] = 1;
  local_50 = plVar5;
  _i = (ulong)uVar1;
  __vla_expr0 = (unsigned_long)alStack_88;
  *(undefined8 *)((long)&lStack_90 + lVar2) = 0x104d2b;
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_28);
  local_40 = (int)sVar3;
  while (local_40 = local_40 + -1, -1 < local_40) {
    local_44 = 0;
    while( true ) {
      local_60 = (ulong)local_44;
      local_68 = local_58->adjacencyVector;
      sVar3 = (size_type)local_40;
      *(undefined8 *)((long)&lStack_90 + lVar2) = 0x104d63;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_28,sVar3);
      pvVar6 = local_68 + *pvVar4;
      *(undefined8 *)((long)&lStack_90 + lVar2) = 0x104d76;
      sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar6);
      if (sVar3 <= local_60) break;
      local_78 = local_58->adjacencyVector;
      sVar3 = (size_type)local_40;
      *(undefined8 *)((long)&lStack_90 + lVar2) = 0x104d9e;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_28,sVar3);
      pvVar6 = local_78 + *pvVar4;
      sVar3 = (size_type)local_44;
      *(undefined8 *)((long)&lStack_90 + lVar2) = 0x104db5;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,sVar3);
      local_70 = local_50[*pvVar4] % 0x3b9aca07;
      sVar3 = (size_type)local_40;
      *(undefined8 *)((long)&lStack_90 + lVar2) = 0x104dde;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_28,sVar3);
      local_50[*pvVar4] = local_70 + local_50[*pvVar4];
      sVar3 = (size_type)local_40;
      *(undefined8 *)((long)&lStack_90 + lVar2) = 0x104e01;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_28,sVar3);
      local_50[*pvVar4] = local_50[*pvVar4] % 0x3b9aca07;
      sVar3 = (size_type)local_40;
      *(undefined8 *)((long)&lStack_90 + lVar2) = 0x104e2e;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_28,sVar3);
      if (local_50[*pvVar4] < 0) {
        sVar3 = (size_type)local_40;
        *(undefined8 *)((long)&lStack_90 + lVar2) = 0x104e4c;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_28,sVar3);
        local_50[*pvVar4] = local_50[*pvVar4] + 0x3b9aca07;
      }
      local_44 = local_44 + 1;
    }
  }
  alStack_88[1] = *local_50;
  *(undefined8 *)(__vla_expr0 - 8) = 0x104ea0;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return alStack_88[1];
}

Assistant:

long long Graph::solve() {
    vector<int> temp = ts();
    long long result[this->size];
    for (int k = 0; k < this->size; ++k) {
        result[k]=0;
    }
    result[this->size-1] = 1;
    for (int i = temp.size() - 1; i >= 0; i--) {
        for (int j = 0; j < adjacencyVector[temp[i]].size(); j++) {
            result[temp[i]] += (result[adjacencyVector[temp[i]][j]]%1000000007);
            result[temp[i]]%=1000000007;
            if(result[temp[i]]<0){
                result[temp[i]]+=1000000007;
            }
        }
    }
    return result[0];
}